

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86.cpp
# Opt level: O0

int __thiscall ncnn::GELU_x86::forward_inplace(GELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  Option *in_RDX;
  Mat *in_RSI;
  GELU *in_RDI;
  float fVar4;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  v4sf afVar5;
  __m128 _blob;
  __m128 _cube;
  __m128 _pLoad;
  __m128 _fast2c128;
  __m128 _fast1c128;
  __m128 _one128;
  __m128 _half128;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_378;
  undefined8 uStackY_370;
  int local_300;
  float *local_2a8;
  int local_29c;
  int local_264;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  
  if (*(int *)((long)&in_RDI->fast_gelu + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 0) {
    local_264 = GELU::forward_inplace(in_RDI,in_RSI,in_RDX);
  }
  else {
    iVar2 = in_RSI->c;
    iVar3 = in_RSI->w * in_RSI->h * in_RSI->d * in_RSI->elempack;
    for (local_29c = 0; local_29c < iVar2; local_29c = local_29c + 1) {
      local_2a8 = (float *)((long)in_RSI->data + in_RSI->cstep * (long)local_29c * in_RSI->elemsize)
      ;
      for (local_300 = 0; local_300 + 3 < iVar3; local_300 = local_300 + 4) {
        local_f8 = (float)*(undefined8 *)local_2a8;
        fStack_f4 = (float)((ulong)*(undefined8 *)local_2a8 >> 0x20);
        fStack_f0 = (float)*(undefined8 *)(local_2a8 + 2);
        fStack_ec = (float)((ulong)*(undefined8 *)(local_2a8 + 2) >> 0x20);
        afVar5[2] = 0.7978845;
        afVar5[3] = 0.7978845;
        afVar5[0] = (local_f8 + local_f8 * local_f8 * local_f8 * 0.044715) * 0.7978845;
        afVar5[1] = (fStack_f4 + fStack_f4 * fStack_f4 * fStack_f4 * 0.044715) * 0.7978845;
        afVar5 = tanh_ps(afVar5);
        local_e8 = afVar5[0];
        fStack_e4 = afVar5[1];
        local_378 = CONCAT44((fStack_e4 + 1.0) * fStack_f4 * 0.5,(local_e8 + 1.0) * local_f8 * 0.5);
        uStackY_370._0_4_ = (extraout_XMM0_Dc + 1.0) * fStack_f0 * 0.5;
        uStackY_370._4_4_ = (extraout_XMM0_Dd + 1.0) * fStack_ec * 0.5;
        *(undefined8 *)local_2a8 = local_378;
        *(undefined8 *)(local_2a8 + 2) = uStackY_370;
        local_2a8 = local_2a8 + 4;
      }
      for (; local_300 < iVar3; local_300 = local_300 + 1) {
        fVar1 = *local_2a8;
        fVar4 = tanhf((*local_2a8 + *local_2a8 * 0.044715 * *local_2a8 * *local_2a8) * 0.7978845);
        *local_2a8 = fVar1 * 0.5 * (fVar4 + 1.0);
        local_2a8 = local_2a8 + 1;
      }
    }
    local_264 = 0;
  }
  return local_264;
}

Assistant:

int GELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}